

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O2

SiameseResult __thiscall
siamese::Encoder::GenerateSinglePacket(Encoder *this,SiameseRecoveryPacket *packet)

{
  GrowingAlignedDataBuffer *this_00;
  ostringstream *this_01;
  EncoderSubwindow *pEVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  SiameseResult SVar7;
  uint8_t *puVar8;
  OutputWorker *this_02;
  long lStack_1c0;
  LogStringBuffer local_1b0;
  
  uVar6 = (this->Window).FirstUnremovedElement;
  uVar5 = uVar6 & 0x3f;
  pEVar1 = (this->Window).Subwindows.DataPtr[uVar6 >> 6];
  uVar6 = (pEVar1->Originals)._M_elems[uVar5].Buffer.Bytes;
  this_00 = &(pEVar1->Originals)._M_elems[uVar5].Buffer;
  bVar4 = GrowingAlignedDataBuffer::GrowZeroPadded(this_00,&this->TheAllocator,uVar6 + 8);
  if (bVar4) {
    this_00->Bytes = uVar6;
    uVar5 = *(uint *)&this_00[1].Data;
    puVar8 = this_00->Data + uVar6;
    if (uVar5 < 0x80) {
      *puVar8 = (uint8_t)uVar5;
      lStack_1c0 = 1;
    }
    else {
      bVar3 = (byte)(uVar5 >> 8);
      *puVar8 = (uint8_t)uVar5;
      if (uVar5 < 0x4000) {
        puVar8[1] = bVar3 | 0x80;
        lStack_1c0 = 2;
      }
      else {
        puVar8[1] = bVar3;
        puVar8[2] = (byte)(uVar5 >> 0x10) | 0xc0;
        lStack_1c0 = 3;
      }
    }
    puVar8[lStack_1c0] = '\0';
    packet->Data = this_00->Data;
    uVar6 = uVar6 + 1 + (int)lStack_1c0;
    packet->DataBytes = uVar6;
    if (DAT_0019e278 < 3) {
      this_01 = &local_1b0.LogStream;
      local_1b0.ChannelName = Logger;
      local_1b0.LogLevel = Info;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
      std::operator<<((ostream *)this_01,(string *)&DAT_0019e2a8);
      std::operator<<((ostream *)this_01,"Generated single recovery packet start=");
      std::ostream::_M_insert<unsigned_long>((ulong)this_01);
      std::operator<<((ostream *)this_01," ldpcCount=");
      std::ostream::_M_insert<unsigned_long>((ulong)this_01);
      std::operator<<((ostream *)this_01," sumCount=");
      std::ostream::_M_insert<unsigned_long>((ulong)this_01);
      std::operator<<((ostream *)this_01," row=");
      std::ostream::_M_insert<unsigned_long>((ulong)this_01);
      this_02 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_02,&local_1b0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
      uVar6 = packet->DataBytes;
    }
    auVar2 = vpmovsxbq_avx(ZEXT216(0x101));
    auVar2 = vpinsrq_avx(auVar2,(ulong)uVar6,1);
    auVar2 = vpaddq_avx(auVar2,*(undefined1 (*) [16])((this->Stats).Counts + 2));
    SVar7 = Siamese_Success;
    *(undefined1 (*) [16])((this->Stats).Counts + 2) = auVar2;
  }
  else {
    (this->Window).EmergencyDisabled = true;
    SVar7 = Siamese_Disabled;
  }
  return SVar7;
}

Assistant:

SiameseResult Encoder::GenerateSinglePacket(SiameseRecoveryPacket& packet)
{
    OriginalPacket* original     = Window.GetWindowElement(Window.FirstUnremovedElement);
    const unsigned originalBytes = original->Buffer.Bytes;

    // Note: This often does not actually reallocate or move since we overallocate
    if (!original->Buffer.GrowZeroPadded(&TheAllocator, originalBytes + kMaxRecoveryMetadataBytes))
    {
        Window.EmergencyDisabled = true;
        return Siamese_Disabled;
    }

    // Set bytes back to original
    original->Buffer.Bytes = originalBytes;

    // Serialize metadata into the last few bytes of the packet
    // Note: This saves an extra copy to move the data around
    RecoveryMetadata metadata;
    metadata.SumCount    = 1;
    metadata.LDPCCount   = 1;
    metadata.ColumnStart = original->Column;
    metadata.Row         = 0;

    const unsigned footerBytes = SerializeFooter_RecoveryMetadata(metadata, original->Buffer.Data + originalBytes);
    packet.Data      = original->Buffer.Data;
    packet.DataBytes = originalBytes + footerBytes;

    Logger.Info("Generated single recovery packet start=", metadata.ColumnStart, " ldpcCount=", metadata.LDPCCount, " sumCount=", metadata.SumCount, " row=", metadata.Row);

    Stats.Counts[SiameseEncoderStats_RecoveryCount]++;
    Stats.Counts[SiameseEncoderStats_RecoveryBytes] += packet.DataBytes;

    return Siamese_Success;
}